

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.c
# Opt level: O2

server_info * choose_server(server_info **excludes,int count)

{
  server_info **ppsVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  sockaddr_in sa_any;
  sockaddr_in6 sa6_any;
  server_info *servers_1 [16];
  server_info *valid_servers [16];
  server_info *servers [16];
  
  uVar2 = 0x10;
  if (g_svr_count < 0x10) {
    uVar2 = (ulong)g_svr_count;
  }
  uVar4 = 0;
  uVar3 = (ulong)(uint)count;
  if (count < 1) {
    uVar3 = uVar4;
  }
  do {
    if (uVar4 == uVar2) {
      return (server_info *)0x0;
    }
    uVar5 = 0;
    do {
      if (uVar3 == uVar5) break;
      ppsVar1 = excludes + uVar5;
      uVar5 = uVar5 + 1;
    } while (*ppsVar1 != g_svr_cfg + uVar4);
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

static struct server_info * choose_server(struct server_info ** excludes, int count)
{
    struct server_info * servers[MAX_SERVERS];
    int i, j, k;
    int svr_count = g_svr_count <= MAX_SERVERS ? g_svr_count : MAX_SERVERS;

    k = 0;
    for (i = 0; i < svr_count; i++) {
        bool found = false;
        for (j = 0; j < count; j++)
            if (excludes[j] == g_svr_cfg + i) {
                found = true;
                break;
            }
        if (!found) {
            // Only put a server as candidate if it has been tested and is not hijacked.
            if ((g_svr_cfg[i].flags & SF_TEST_DONE) && !(g_svr_cfg[i].flags & SF_HIJACKED)) {
                servers[k] = g_svr_cfg + i;
                k += 1;
            }
        }
    }
    return _choose_server(servers, k);
}